

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_minimize_assumptions2(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_5c;
  int RetValue_2;
  int LitNot_2;
  int RetValue_1;
  int LitNot_1;
  int Temp;
  int status;
  int LitNot;
  int RetValue;
  int nResR;
  int nResL;
  int nLitsR;
  int nLitsL;
  int k;
  int i;
  int nConfLimit_local;
  int nLits_local;
  int *pLits_local;
  sat_solver *s_local;
  
  k = nConfLimit;
  i = nLits;
  _nConfLimit_local = pLits;
  pLits_local = &s->size;
  if (nLits == 1) {
    status = 1;
    Temp = Abc_LitNot(*pLits);
    LitNot_1 = -1;
    RetValue_1 = (int)*(undefined8 *)(pLits_local + 0x7c);
    *(long *)(pLits_local + 0x7c) = (long)k;
    status = sat_solver_push((sat_solver *)pLits_local,Temp);
    if (status == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x8f6,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
    }
    LitNot_1 = sat_solver_solve_internal((sat_solver *)pLits_local);
    sat_solver_pop((sat_solver *)pLits_local);
    if ((LitNot_1 == -1) &&
       (status = sat_solver_addclause((sat_solver *)pLits_local,&Temp,&status), status == 0)) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x8fe,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
    }
    *(long *)(pLits_local + 0x7c) = (long)RetValue_1;
    s_local._4_4_ = (uint)(LitNot_1 != -1);
  }
  else {
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x904,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
    }
    nResL = nLits / 2;
    nResR = nLits - nResL;
    for (nLitsL = 0; nLitsL < nResL; nLitsL = nLitsL + 1) {
      iVar1 = sat_solver_push((sat_solver *)pLits_local,_nConfLimit_local[nLitsL]);
      if (iVar1 == 0) {
        for (nLitsR = nLitsL; iVar1 = nLitsL, -1 < nLitsR; nLitsR = nLitsR + -1) {
          sat_solver_pop((sat_solver *)pLits_local);
        }
        do {
          nLitsR = iVar1 + 1;
          if (nLitsR <= nResL) {
            iVar1 = sat_solver_minimize_assumptions2
                              ((sat_solver *)pLits_local,_nConfLimit_local,nLitsL + 1,k);
            return iVar1;
          }
          LitNot_2 = Abc_LitNot(_nConfLimit_local[nLitsL]);
          RetValue_2 = sat_solver_addclause((sat_solver *)pLits_local,&LitNot_2,&RetValue_1);
          iVar1 = nLitsR;
        } while (RetValue_2 != 0);
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x913,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
      }
    }
    RetValue = sat_solver_minimize_assumptions2
                         ((sat_solver *)pLits_local,_nConfLimit_local + nResL,nResR,k);
    for (nLitsL = 0; nLitsL < nResL; nLitsL = nLitsL + 1) {
      sat_solver_pop((sat_solver *)pLits_local);
    }
    veci_resize((veci *)(pLits_local + 0xa2),0);
    for (nLitsL = 0; nLitsL < nResL; nLitsL = nLitsL + 1) {
      veci_push((veci *)(pLits_local + 0xa2),_nConfLimit_local[nLitsL]);
    }
    for (nLitsL = 0; nLitsL < RetValue; nLitsL = nLitsL + 1) {
      _nConfLimit_local[nLitsL] = _nConfLimit_local[nResL + nLitsL];
    }
    for (nLitsL = 0; nLitsL < nResL; nLitsL = nLitsL + 1) {
      piVar3 = veci_begin((veci *)(pLits_local + 0xa2));
      _nConfLimit_local[RetValue + nLitsL] = piVar3[nLitsL];
    }
    for (nLitsL = 0; nLitsL < RetValue; nLitsL = nLitsL + 1) {
      iVar1 = sat_solver_push((sat_solver *)pLits_local,_nConfLimit_local[nLitsL]);
      if (iVar1 == 0) {
        for (nLitsR = nLitsL; iVar1 = nLitsL, -1 < nLitsR; nLitsR = nLitsR + -1) {
          sat_solver_pop((sat_solver *)pLits_local);
        }
        do {
          nLitsR = iVar1 + 1;
          if (nLitsR <= RetValue) {
            iVar1 = sat_solver_minimize_assumptions2
                              ((sat_solver *)pLits_local,_nConfLimit_local,nLitsL + 1,k);
            return iVar1;
          }
          local_5c = Abc_LitNot(_nConfLimit_local[nLitsL]);
          iVar2 = sat_solver_addclause((sat_solver *)pLits_local,&local_5c,&RetValue_2);
          iVar1 = nLitsR;
        } while (iVar2 != 0);
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x931,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
      }
    }
    LitNot = sat_solver_minimize_assumptions2
                       ((sat_solver *)pLits_local,_nConfLimit_local + RetValue,nResL,k);
    for (nLitsL = 0; nLitsL < RetValue; nLitsL = nLitsL + 1) {
      sat_solver_pop((sat_solver *)pLits_local);
    }
    s_local._4_4_ = RetValue + LitNot;
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_minimize_assumptions2( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int RetValue = 1, LitNot = Abc_LitNot(pLits[0]);
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;

        RetValue = sat_solver_push( s, LitNot ); assert( RetValue );
        status = sat_solver_solve_internal( s );
        sat_solver_pop( s );

        // if the problem is UNSAT, add clause
        if ( status == l_False )
        {
            RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
            assert( RetValue );
        }

        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nLitsL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver_minimize_assumptions2( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nResL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver_minimize_assumptions2( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}